

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# cuddExact.c
# Opt level: O0

int updateUB(DdManager *table,int oldBound,DdHalfWord *bestOrder,int lower,int upper)

{
  int iVar1;
  int local_34;
  int newBound;
  int i;
  int upper_local;
  int lower_local;
  DdHalfWord *bestOrder_local;
  int oldBound_local;
  DdManager *table_local;
  
  iVar1 = table->keys - table->isolated;
  local_34 = lower;
  table_local._4_4_ = oldBound;
  if (iVar1 < oldBound) {
    for (; table_local._4_4_ = iVar1, local_34 <= upper; local_34 = local_34 + 1) {
      bestOrder[local_34 - lower] = table->invperm[local_34];
    }
  }
  return table_local._4_4_;
}

Assistant:

static int
updateUB(
  DdManager * table,
  int  oldBound,
  DdHalfWord * bestOrder,
  int  lower,
  int  upper)
{
    int i;
    int newBound = table->keys - table->isolated;

    if (newBound < oldBound) {
#ifdef DD_STATS
        (void) fprintf(table->out,"New upper bound = %d\n", newBound);
        fflush(table->out);
#endif
        for (i = lower; i <= upper; i++)
            bestOrder[i-lower] = (DdHalfWord) table->invperm[i];
        return(newBound);
    } else {
        return(oldBound);
    }

}